

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.c
# Opt level: O0

void refreshLine(linenoiseState *l)

{
  linenoiseState *l_local;
  
  if (mlmode == 0) {
    refreshSingleLine(l);
  }
  else {
    refreshMultiLine(l);
  }
  return;
}

Assistant:

static void refreshLine(struct linenoiseState *l) {
    if (mlmode)
        refreshMultiLine(l);
    else
        refreshSingleLine(l);
}